

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_bias_test.cc
# Opt level: O0

void intgemm::kernel_add_bias_test<(intgemm::CPUType)4,int>(void)

{
  longlong alVar1 [8];
  vector_t<CPUType::AVX512BW,_int> input_00;
  int *__first;
  int *__last;
  longlong (*palVar2) [8];
  size_t sVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  AssertionHandler catchAssertionHandler;
  size_t i;
  AlignedVector<int> output;
  AlignedVector<int> bias;
  AlignedVector<int> input;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 in_stack_fffffffffffffd00 [64];
  ExprLhs<const_int_&> *in_stack_fffffffffffffd40;
  Index in_stack_fffffffffffffe6c;
  int *in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe78 [40];
  undefined1 in_stack_fffffffffffffea0 [16];
  longlong in_stack_fffffffffffffeb0;
  size_t local_108;
  AlignedVector<int> local_90 [2];
  AlignedVector<int> local_70;
  AlignedVector<int> local_60 [5];
  
  auVar7 = in_stack_fffffffffffffd00._0_32_;
  if (3 < kCPU) {
    AlignedVector<int>::AlignedVector
              (in_stack_fffffffffffffd00._24_8_,in_stack_fffffffffffffd00._16_8_,
               in_stack_fffffffffffffd00._8_8_);
    AlignedVector<int>::AlignedVector(auVar7._24_8_,auVar7._16_8_,auVar7._8_8_);
    auVar6 = auVar7._0_16_;
    AlignedVector<int>::AlignedVector(auVar7._24_8_,auVar7._16_8_,auVar7._8_8_);
    __first = AlignedVector<int>::begin(local_60);
    __last = AlignedVector<int>::end(local_60);
    std::iota<int*,int>(__first,__last,0);
    AlignedVector<int>::begin(&local_70);
    AlignedVector<int>::end(&local_70);
    std::fill<int*,int>(auVar6._8_8_,auVar6._0_8_,(int *)0x26320c);
    palVar2 = AlignedVector<int>::as<long_long__vector(8)>(local_60);
    auVar4 = vmovdqa64_avx512f((undefined1  [64])*palVar2);
    AlignedVector<int>::begin(&local_70);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar5 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar5);
    input_00[5] = in_stack_fffffffffffffea0._0_8_;
    input_00[6] = in_stack_fffffffffffffea0._8_8_;
    input_00[0] = in_stack_fffffffffffffe78._0_8_;
    input_00[1] = in_stack_fffffffffffffe78._8_8_;
    input_00[2] = in_stack_fffffffffffffe78._16_8_;
    input_00[3] = in_stack_fffffffffffffe78._24_8_;
    input_00[4] = in_stack_fffffffffffffe78._32_8_;
    input_00[7] = in_stack_fffffffffffffeb0;
    kernels::add_bias(input_00,in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    palVar2 = AlignedVector<int>::as<long_long__vector(8)>(local_90);
    alVar1 = (longlong  [8])vmovdqa64_avx512f(auVar5);
    *palVar2 = alVar1;
    for (local_108 = 0; sVar3 = AlignedVector<int>::size(local_90), local_108 < sVar3;
        local_108 = local_108 + 1) {
      operator____catch_sr(auVar4._8_8_,auVar4._0_8_);
      Catch::SourceLineInfo::SourceLineInfo
                ((SourceLineInfo *)&stack0xfffffffffffffe90,
                 "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/add_bias_test.cc"
                 ,0x1d);
      Catch::StringRef::StringRef(auVar4._24_8_,auVar4._16_8_);
      Catch::AssertionHandler::AssertionHandler
                (auVar4._24_8_,auVar4._16_8_,auVar4._8_8_,auVar4._32_16_,auVar4._4_4_);
      AlignedVector<int>::operator[](local_90,local_108);
      Catch::Decomposer::operator<=(auVar4._0_8_,(int *)0x2633b1);
      Catch::ExprLhs<int_const&>::operator==(in_stack_fffffffffffffd40,auVar4._56_8_);
      Catch::AssertionHandler::handleExpr(auVar4._8_8_,auVar4._0_8_);
      Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
                ((BinaryExpr<const_int_&,_const_int_&> *)0x263419);
      Catch::AssertionHandler::complete(auVar4._8_8_);
      Catch::AssertionHandler::~AssertionHandler(auVar4._8_8_);
    }
    AlignedVector<int>::~AlignedVector((AlignedVector<int> *)0x26354d);
    AlignedVector<int>::~AlignedVector((AlignedVector<int> *)0x26355a);
    AlignedVector<int>::~AlignedVector((AlignedVector<int> *)0x263567);
  }
  return;
}

Assistant:

void kernel_add_bias_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr static auto VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> bias(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(0));
  std::fill(bias.begin(), bias.end(), static_cast<ElemType_>(100));

  *output.template as<vec_t>() = kernels::add_bias(*input.template as<vec_t>(), bias.begin(), 0);
  for (std::size_t i = 0; i < output.size(); ++i)
#if !defined( __EXCEPTIONS) && defined(__GNUC__) && (__GNUC__ == 9) && ((__GNUC_MINOR__ == 3) || (__GNUC_MINOR__ == 4))
    CHECK(output[i] == static_cast<ElemType_>(bias[i] + input[i])); // GCC 9.3 - exceptions breaks std::iota with newer check.
#else
    CHECK(output[i] == ElemType_(100 + i));
#endif
}